

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QWizardDefaultProperty>::moveAppend
          (QGenericArrayOps<QWizardDefaultProperty> *this,QWizardDefaultProperty *b,
          QWizardDefaultProperty *e)

{
  QWizardDefaultProperty *pQVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QWizardDefaultProperty>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QWizardDefaultProperty>).size;
    do {
      pDVar2 = (b->className).d.d;
      (b->className).d.d = (Data *)0x0;
      pQVar1[qVar5].className.d.d = pDVar2;
      pcVar3 = (b->className).d.ptr;
      (b->className).d.ptr = (char *)0x0;
      pQVar1[qVar5].className.d.ptr = pcVar3;
      qVar4 = (b->className).d.size;
      (b->className).d.size = 0;
      pQVar1[qVar5].className.d.size = qVar4;
      pDVar2 = (b->property).d.d;
      (b->property).d.d = (Data *)0x0;
      pQVar1[qVar5].property.d.d = pDVar2;
      pcVar3 = (b->property).d.ptr;
      (b->property).d.ptr = (char *)0x0;
      pQVar1[qVar5].property.d.ptr = pcVar3;
      qVar4 = (b->property).d.size;
      (b->property).d.size = 0;
      pQVar1[qVar5].property.d.size = qVar4;
      pDVar2 = (b->changedSignal).d.d;
      (b->changedSignal).d.d = (Data *)0x0;
      pQVar1[qVar5].changedSignal.d.d = pDVar2;
      pcVar3 = (b->changedSignal).d.ptr;
      (b->changedSignal).d.ptr = (char *)0x0;
      pQVar1[qVar5].changedSignal.d.ptr = pcVar3;
      qVar4 = (b->changedSignal).d.size;
      (b->changedSignal).d.size = 0;
      pQVar1[qVar5].changedSignal.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QWizardDefaultProperty>).size + 1;
      (this->super_QArrayDataPointer<QWizardDefaultProperty>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }